

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_fill_rect_multi_color
               (nk_draw_list *list,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  nk_convert_config *config;
  uint uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  void *pvVar21;
  nk_draw_index *pnVar22;
  nk_draw_index nVar23;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_colorf color;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_vec2 local_c8;
  float local_b8;
  float fStack_b4;
  
  if (list != (nk_draw_list *)0x0) {
    nk_draw_list_push_image(list,(list->config).null.texture);
    uVar1 = list->vertex_count;
    pvVar21 = nk_draw_list_alloc_vertices(list,4);
    pnVar22 = nk_draw_list_alloc_elements(list,6);
    if (pnVar22 != (nk_draw_index *)0x0 && pvVar21 != (void *)0x0) {
      uVar14 = (ulong)left._0_2_ & 0xffffffffffff00ff;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar14;
      auVar2[0xc] = left.a;
      auVar3[8] = left.b;
      auVar3._0_8_ = uVar14;
      auVar3[9] = 0;
      auVar3._10_3_ = auVar2._10_3_;
      auVar17._5_8_ = 0;
      auVar17._0_5_ = auVar3._8_5_;
      auVar4[4] = left.g;
      auVar4._0_4_ = (int)uVar14;
      auVar4[5] = 0;
      auVar4._6_7_ = SUB137(auVar17 << 0x40,6);
      color.r = (float)(int)uVar14 * 0.003921569;
      color.g = (float)auVar4._4_4_ * 0.003921569;
      color.b = (float)((uint)left >> 0x10 & 0xff) * 0.003921569;
      color.a = (float)((uint)left >> 0x18) * 0.003921569;
      uVar14 = (ulong)right._0_2_ & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar14;
      auVar5[0xc] = right.a;
      auVar6[8] = right.b;
      auVar6._0_8_ = uVar14;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar18._5_8_ = 0;
      auVar18._0_5_ = auVar6._8_5_;
      auVar7[4] = right.g;
      auVar7._0_4_ = (int)uVar14;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar18 << 0x40,6);
      color_01.a = (float)((uint)right >> 0x18) * 0.003921569;
      color_01.b = (float)((uint)right >> 0x10 & 0xff) * 0.003921569;
      uVar15 = (ulong)top._0_2_ & 0xffffffffffff00ff;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar15;
      auVar8[0xc] = top.a;
      auVar9[8] = top.b;
      auVar9._0_8_ = uVar15;
      auVar9[9] = 0;
      auVar9._10_3_ = auVar8._10_3_;
      auVar19._5_8_ = 0;
      auVar19._0_5_ = auVar9._8_5_;
      auVar10[4] = top.g;
      auVar10._0_4_ = (int)uVar15;
      auVar10[5] = 0;
      auVar10._6_7_ = SUB137(auVar19 << 0x40,6);
      color_00.a = (float)((uint)top >> 0x18) * 0.003921569;
      color_00.b = (float)((uint)top >> 0x10 & 0xff) * 0.003921569;
      uVar16 = (ulong)bottom._0_2_ & 0xffffffffffff00ff;
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar16;
      auVar11[0xc] = bottom.a;
      auVar12[8] = bottom.b;
      auVar12._0_8_ = uVar16;
      auVar12[9] = 0;
      auVar12._10_3_ = auVar11._10_3_;
      auVar20._5_8_ = 0;
      auVar20._0_5_ = auVar12._8_5_;
      auVar13[4] = bottom.g;
      auVar13._0_4_ = (int)uVar16;
      auVar13[5] = 0;
      auVar13._6_7_ = SUB137(auVar20 << 0x40,6);
      color_02.a = (float)((uint)bottom >> 0x18) * 0.003921569;
      color_02.b = (float)((uint)bottom >> 0x10 & 0xff) * 0.003921569;
      config = &list->config;
      nVar23 = (nk_draw_index)uVar1;
      *pnVar22 = nVar23;
      pnVar22[1] = nVar23 + 1;
      pnVar22[2] = nVar23 + 2;
      pnVar22[3] = nVar23;
      pnVar22[4] = nVar23 + 2;
      pnVar22[5] = nVar23 + 3;
      pvVar21 = nk_draw_vertex(pvVar21,config,rect._0_8_,(list->config).null.uv,color);
      local_c8.x = rect.w;
      local_c8.y = rect.h;
      local_b8 = rect.x;
      fStack_b4 = rect.y;
      local_c8.x = local_c8.x + local_b8;
      local_c8.y = local_c8.y + fStack_b4;
      pos.y = fStack_b4;
      pos.x = local_c8.x;
      color_00.g = (float)auVar10._4_4_ * 0.003921569;
      color_00.r = (float)(int)uVar15 * 0.003921569;
      pvVar21 = nk_draw_vertex(pvVar21,config,pos,(list->config).null.uv,color_00);
      color_01.g = (float)auVar7._4_4_ * 0.003921569;
      color_01.r = (float)(int)uVar14 * 0.003921569;
      pvVar21 = nk_draw_vertex(pvVar21,config,local_c8,(list->config).null.uv,color_01);
      pos_00.y = local_c8.y;
      pos_00.x = local_b8;
      color_02.g = (float)auVar13._4_4_ * 0.003921569;
      color_02.r = (float)(int)uVar16 * 0.003921569;
      nk_draw_vertex(pvVar21,config,pos_00,(list->config).null.uv,color_02);
      return;
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_rect_multi_color(struct nk_draw_list *list, struct nk_rect rect,
struct nk_color left, struct nk_color top, struct nk_color right,
struct nk_color bottom)
{
void *vtx;
struct nk_colorf col_left, col_top;
struct nk_colorf col_right, col_bottom;
nk_draw_index *idx;
nk_draw_index index;

nk_color_fv(&col_left.r, left);
nk_color_fv(&col_right.r, right);
nk_color_fv(&col_top.r, top);
nk_color_fv(&col_bottom.r, bottom);

NK_ASSERT(list);
if (!list) return;

nk_draw_list_push_image(list, list->config.null.texture);
index = (nk_draw_index)list->vertex_count;
vtx = nk_draw_list_alloc_vertices(list, 4);
idx = nk_draw_list_alloc_elements(list, 6);
if (!vtx || !idx) return;

idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y), list->config.null.uv, col_left);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y), list->config.null.uv, col_top);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y + rect.h), list->config.null.uv, col_right);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y + rect.h), list->config.null.uv, col_bottom);
}